

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O0

HRESULT __thiscall Js::SimpleDataCacheWrapper::WriteHeader(SimpleDataCacheWrapper *this)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  DWORD local_20;
  HRESULT hr;
  DWORD jscriptMinorVersion;
  DWORD jscriptMajorVersion;
  SimpleDataCacheWrapper *this_local;
  
  _jscriptMinorVersion = this;
  this_local._4_4_ =
       AutoSystemInfo::GetJscriptFileVersion((DWORD *)&hr,&local_20,(DWORD *)0x0,(DWORD *)0x0);
  if (-1 < this_local._4_4_) {
    if (this->bytesWrittenInBlock != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimpleDataCacheWrapper.cpp"
                                  ,0x74,"(this->bytesWrittenInBlock == 0)",
                                  "this->bytesWrittenInBlock == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local._4_4_ = Write<unsigned_int>(this,(uint *)&hr);
    if (((-1 < this_local._4_4_) &&
        (HVar3 = Write<unsigned_int>(this,&local_20), this_local._4_4_ = HVar3, -1 < HVar3)) &&
       (this->bytesWrittenInBlock != 8)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimpleDataCacheWrapper.cpp"
                                  ,0x79,"(this->bytesWrittenInBlock == sizeof(DWORD) * 2)",
                                  "this->bytesWrittenInBlock == sizeof(DWORD) * 2");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

HRESULT SimpleDataCacheWrapper::WriteHeader()
    {
        DWORD jscriptMajorVersion;
        DWORD jscriptMinorVersion;
        HRESULT hr = E_FAIL;

        IFFAILRET(AutoSystemInfo::GetJscriptFileVersion(&jscriptMajorVersion, &jscriptMinorVersion));

        Assert(this->bytesWrittenInBlock == 0);

        IFFAILRET(Write(jscriptMajorVersion));
        IFFAILRET(Write(jscriptMinorVersion));

        Assert(this->bytesWrittenInBlock == sizeof(DWORD) * 2);

        return hr;
    }